

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnElemSegmentElemExpr_RefNull
          (BinaryReaderInterp *this,Index segment_index,Type type)

{
  bool bVar1;
  value_type local_60;
  reference local_58;
  ElemDesc *elem;
  Location local_48;
  Enum local_28;
  Index local_24;
  BinaryReaderInterp *pBStack_20;
  Index segment_index_local;
  BinaryReaderInterp *this_local;
  Type type_local;
  
  local_24 = segment_index;
  pBStack_20 = this;
  unique0x100000db = type;
  GetLocation(&local_48,this);
  elem = (ElemDesc *)stack0xffffffffffffffec;
  local_28 = (Enum)SharedValidator::OnElemSegmentElemExpr_RefNull
                             (&this->validator_,&local_48,stack0xffffffffffffffec);
  bVar1 = Failed((Result)local_28);
  if (bVar1) {
    Result::Result((Result *)&type_local,Error);
  }
  else {
    local_58 = std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::back
                         (&this->module_->elems);
    local_60.kind = RefNull;
    local_60.index = 0;
    std::vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>::push_back
              (&local_58->elements,&local_60);
    Result::Result((Result *)&type_local,Ok);
  }
  return (Result)type_local.enum_;
}

Assistant:

Result BinaryReaderInterp::OnElemSegmentElemExpr_RefNull(Index segment_index,
                                                         Type type) {
  CHECK_RESULT(validator_.OnElemSegmentElemExpr_RefNull(GetLocation(), type));
  ElemDesc& elem = module_.elems.back();
  elem.elements.push_back(ElemExpr{ElemKind::RefNull, 0});
  return Result::Ok;
}